

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionRule>::emplace<QTzTransitionRule_const&>
          (QPodArrayOps<QTzTransitionRule> *this,qsizetype i,QTzTransitionRule *args)

{
  QTzTransitionRule **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QTzTransitionRule *pQVar5;
  int iVar6;
  int iVar7;
  quint8 qVar8;
  undefined3 uVar9;
  QTzTransitionRule *pQVar10;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QTzTransitionRule>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0041060c:
    qVar8 = args->abbreviationIndex;
    uVar9 = *(undefined3 *)&args->field_0x9;
    iVar6 = args->stdOffset;
    iVar7 = args->dstOffset;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTzTransitionRule>).size != 0)
    ;
    QArrayDataPointer<QTzTransitionRule>::detachAndGrow
              (&this->super_QArrayDataPointer<QTzTransitionRule>,where,1,(QTzTransitionRule **)0x0,
               (QArrayDataPointer<QTzTransitionRule> *)0x0);
    pQVar10 = createHole(this,where,i,1);
    pQVar10->stdOffset = iVar6;
    pQVar10->dstOffset = iVar7;
    pQVar10->abbreviationIndex = qVar8;
    *(undefined3 *)&pQVar10->field_0x9 = uVar9;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QTzTransitionRule>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QTzTransitionRule>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) *
        -0x5555555555555555)) {
      pQVar10 = (this->super_QArrayDataPointer<QTzTransitionRule>).ptr;
      uVar9 = *(undefined3 *)&args->field_0x9;
      pQVar5 = pQVar10 + lVar4;
      pQVar5->abbreviationIndex = args->abbreviationIndex;
      *(undefined3 *)&pQVar5->field_0x9 = uVar9;
      iVar6 = args->dstOffset;
      pQVar10 = pQVar10 + lVar4;
      pQVar10->stdOffset = args->stdOffset;
      pQVar10->dstOffset = iVar6;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QTzTransitionRule *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QTzTransitionRule>).ptr)) goto LAB_0041060c;
      pQVar10 = (this->super_QArrayDataPointer<QTzTransitionRule>).ptr;
      uVar9 = *(undefined3 *)&args->field_0x9;
      pQVar10[-1].abbreviationIndex = args->abbreviationIndex;
      *(undefined3 *)&pQVar10[-1].field_0x9 = uVar9;
      iVar6 = args->dstOffset;
      pQVar10[-1].stdOffset = args->stdOffset;
      pQVar10[-1].dstOffset = iVar6;
      ppQVar1 = &(this->super_QArrayDataPointer<QTzTransitionRule>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTzTransitionRule>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }